

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O2

string * __thiscall
npy::pyparse::write_boolean_abi_cxx11_(string *__return_storage_ptr__,pyparse *this,bool b)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 0) {
    pcVar2 = "False";
    paVar1 = &local_a;
  }
  else {
    pcVar2 = "True";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string write_boolean(bool b)
{
    if (b)
        return "True";
    else
        return "False";
}